

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_dynamic_import_job(JSContext *ctx,int argc,JSValue *argv)

{
  JSRuntime *pJVar1;
  char *basename;
  char *filename;
  JSModuleDef *m;
  int64_t iVar2;
  JSValueUnion JVar3;
  JSValue val1;
  JSValue JVar4;
  JSValueUnion local_48;
  int64_t local_40;
  JSValue err;
  
  if ((int)argv[2].tag == -7) {
    JVar4 = argv[3];
    val1.tag = argv[2].tag;
    val1.u.ptr = argv[2].u.ptr;
    basename = JS_ToCString(ctx,val1);
    if (basename == (char *)0x0) {
      basename = (char *)0x0;
    }
    else {
      filename = JS_ToCString(ctx,JVar4);
      if (filename != (char *)0x0) {
        m = JS_RunModule(ctx,basename,filename);
        JS_FreeCString(ctx,filename);
        if (m != (JSModuleDef *)0x0) {
          _local_48 = js_get_module_ns(ctx,m);
          if (local_48._8_4_ != 6) {
            JVar4 = JS_Call(ctx,*argv,(JSValue)(ZEXT816(3) << 0x40),1,(JSValue *)&local_48);
            JS_FreeValue(ctx,JVar4);
            iVar2 = local_40;
            JVar3 = local_48;
            goto LAB_00132f16;
          }
        }
      }
    }
  }
  else {
    basename = (char *)0x0;
    JS_ThrowTypeError(ctx,"no function filename for import()");
  }
  pJVar1 = ctx->rt;
  err.u = (pJVar1->current_exception).u;
  err.tag = (pJVar1->current_exception).tag;
  (pJVar1->current_exception).u.int32 = 0;
  (pJVar1->current_exception).tag = 2;
  JVar4 = JS_Call(ctx,argv[1],(JSValue)(ZEXT816(3) << 0x40),1,&err);
  JS_FreeValue(ctx,JVar4);
  iVar2 = err.tag;
  JVar3 = err.u;
LAB_00132f16:
  JVar4.tag = iVar2;
  JVar4.u.float64 = JVar3.float64;
  JS_FreeValue(ctx,JVar4);
  JS_FreeCString(ctx,basename);
  return (JSValue)(ZEXT816(3) << 0x40);
}

Assistant:

static JSValue js_dynamic_import_job(JSContext *ctx,
                                     int argc, JSValueConst *argv)
{
    JSValueConst *resolving_funcs = argv;
    JSValueConst basename_val = argv[2];
    JSValueConst specifier = argv[3];
    JSModuleDef *m;
    const char *basename = NULL, *filename;
    JSValue ret, err, ns;

    if (!JS_IsString(basename_val)) {
        JS_ThrowTypeError(ctx, "no function filename for import()");
        goto exception;
    }
    basename = JS_ToCString(ctx, basename_val);
    if (!basename)
        goto exception;

    filename = JS_ToCString(ctx, specifier);
    if (!filename)
        goto exception;
                     
    m = JS_RunModule(ctx, basename, filename);
    JS_FreeCString(ctx, filename);
    if (!m)
        goto exception;

    /* return the module namespace */
    ns = js_get_module_ns(ctx, m);
    if (JS_IsException(ns))
        goto exception;

    ret = JS_Call(ctx, resolving_funcs[0], JS_UNDEFINED,
                   1, (JSValueConst *)&ns);
    JS_FreeValue(ctx, ret); /* XXX: what to do if exception ? */
    JS_FreeValue(ctx, ns);
    JS_FreeCString(ctx, basename);
    return JS_UNDEFINED;
 exception:

    err = JS_GetException(ctx);
    ret = JS_Call(ctx, resolving_funcs[1], JS_UNDEFINED,
                   1, (JSValueConst *)&err);
    JS_FreeValue(ctx, ret); /* XXX: what to do if exception ? */
    JS_FreeValue(ctx, err);
    JS_FreeCString(ctx, basename);
    return JS_UNDEFINED;
}